

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# S2_easy.cpp
# Opt level: O0

int256_t * primesum::S2_easy(int128_t x,int64_t y,int64_t z,int64_t c,int threads)

{
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  uint uVar1;
  char *pcVar2;
  long in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  char *in_RSI;
  int256_t *in_RDI;
  undefined4 in_stack_00000008;
  int64_t in_stack_000000b8;
  int64_t in_stack_000000c0;
  int64_t in_stack_000000c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_000000d0;
  int64_t in_stack_000000d8;
  int64_t in_stack_000000e0;
  int64_t in_stack_000000e8;
  undefined1 in_stack_000000f0 [16];
  vector<__int128,_std::allocator<__int128>_> prime_sums_1;
  vector<long,_std::allocator<long>_> primes_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000130;
  int in_stack_00000138;
  int64_t in_stack_00000148;
  int64_t in_stack_00000150;
  int64_t in_stack_00000158;
  undefined1 in_stack_00000160 [16];
  vector<long,_std::allocator<long>_> *in_stack_00000190;
  vector<__int128,_std::allocator<__int128>_> *in_stack_00000198;
  int in_stack_000001a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> prime_sums;
  vector<unsigned_int,_std::allocator<unsigned_int>_> primes;
  double time;
  undefined1 *puVar3;
  undefined4 in_stack_fffffffffffffd44;
  vector<__int128,_std::allocator<__int128>_> *in_stack_fffffffffffffd50;
  allocator<char> *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  allocator<char> *max;
  int256_t *max_00;
  allocator<char> *c_00;
  int64_t in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  int256_t in_stack_fffffffffffffde0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  int256_t local_138;
  undefined1 local_110 [48];
  double local_e0;
  char *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  allocator<char> local_c1;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [55];
  allocator<char> local_61;
  string local_60 [48];
  long local_30;
  char *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  c_00 = &local_61;
  max_00 = in_RDI;
  local_30 = in_RCX;
  local_28 = in_RSI;
  local_20 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  print((string *)0x14986a);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  max = &local_99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  print((string *)0x1498c0);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  print((string *)0x149916);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  local_d0 = local_20;
  local_d8 = local_28;
  x_02._8_8_ = in_stack_fffffffffffffdc8;
  x_02._0_8_ = in_stack_fffffffffffffdc0;
  print((int128_t)x_02,in_stack_fffffffffffffdb8,(int64_t)c_00,(int)((ulong)max_00 >> 0x20));
  local_e0 = get_time();
  int256_t::int256_t(in_RDI);
  uVar1 = std::numeric_limits<unsigned_int>::max();
  if ((long)(ulong)uVar1 < local_30) {
    generate_primes<long>(local_30);
    generate_prime_sums<__int128>((int64_t)max_00);
    (anonymous_namespace)::
    S2_easy_OpenMP<primesum::int256_t,std::vector<long,std::allocator<long>>,std::vector<__int128,std::allocator<__int128>>>
              ((uint128_t)in_stack_00000160,in_stack_00000158,in_stack_00000150,in_stack_00000148,
               in_stack_00000190,in_stack_00000198,in_stack_000001a0);
    *(undefined8 *)&in_RDI->low = local_1e8;
    *(undefined8 *)((long)&in_RDI->low + 8) = local_1e0;
    *(undefined8 *)&in_RDI->high = local_1d8;
    *(undefined8 *)((long)&in_RDI->high + 8) = local_1d0;
    std::vector<__int128,_std::allocator<__int128>_>::~vector(in_stack_fffffffffffffd50);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd50);
  }
  else {
    generate_primes<unsigned_int>((int64_t)in_stack_fffffffffffffd78);
    generate_prime_sums<unsigned_long>((int64_t)max);
    pcVar2 = (char *)std::numeric_limits<unsigned_long>::max();
    if (-(long)local_20 < (long)(ulong)(pcVar2 < local_28)) {
      x_00._8_8_ = in_stack_000000d8;
      x_00._0_8_ = in_stack_000000d0;
      (anonymous_namespace)::
      S2_easy_OpenMP<primesum::int256_t,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                ((uint128_t)x_00,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 prime_sums_1.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 prime_sums_1.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (int)prime_sums_1.super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
      *(undefined8 *)&in_RDI->low = local_188;
      *(undefined8 *)((long)&in_RDI->low + 8) = local_180;
      *(undefined8 *)&in_RDI->high = local_178;
      *(undefined8 *)((long)&in_RDI->high + 8) = local_170;
      in_stack_fffffffffffffd78 = local_28;
      in_stack_fffffffffffffd80 = local_20;
    }
    else {
      puVar3 = local_110;
      in_stack_fffffffffffffd70 =
           (allocator<char> *)
           (anonymous_namespace)::
           S2_easy_OpenMP<__int128,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                     ((uint128_t)in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,
                      in_stack_000000d8,in_stack_000000d0,in_stack_00000130,in_stack_00000138);
      x_01._8_4_ = in_stack_00000008;
      x_01._0_8_ = puVar3;
      x_01._12_4_ = in_stack_fffffffffffffd44;
      int256_t::int256_t<__int128,void>(&local_138,(__int128)x_01);
      *(undefined8 *)&in_RDI->low = (undefined8)local_138.low;
      *(undefined8 *)((long)&in_RDI->low + 8) = local_138.low._8_8_;
      *(undefined8 *)&in_RDI->high = (undefined8)local_138.high;
      *(undefined8 *)((long)&in_RDI->high + 8) = local_138.high._8_8_;
      in_stack_fffffffffffffd78 = local_28;
      in_stack_fffffffffffffd80 = local_20;
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd50);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd50);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  print(*(string **)((long)&in_RDI->high + 8),in_stack_fffffffffffffde0,*(double *)&in_RDI->high);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffde8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffde7);
  return max_00;
}

Assistant:

int256_t S2_easy(int128_t x,
                 int64_t y,
                 int64_t z,
                 int64_t c,
                 int threads)
{
  print("");
  print("=== S2_easy(x, y) ===");
  print("Computation of the easy special leaves");
  print(x, y, c, threads);

  double time = get_time();
  int256_t s2_easy;

  // uses less memory
  if (y <= numeric_limits<uint32_t>::max())
  {
    auto primes = generate_primes<uint32_t>(y);
    auto prime_sums = generate_prime_sums<uint64_t>(y);

    if (x <= numeric_limits<uint64_t>::max())
      s2_easy = S2_easy_OpenMP<int128_t>(x, y, z, c, primes, prime_sums, threads);
    else
      s2_easy = S2_easy_OpenMP<int256_t>(x, y, z, c, primes, prime_sums, threads);
  }
  else
  {
    auto primes = generate_primes<int64_t>(y);
    auto prime_sums = generate_prime_sums<int128_t>(y);

    s2_easy = S2_easy_OpenMP<int256_t>(x, y, z, c, primes, prime_sums, threads);
  }

  print("S2_easy", s2_easy, time);
  return s2_easy;
}